

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O0

bool P_Teleport(AActor *thing,DVector3 *pos,DAngle *angle,int flags)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  secplane_t *psVar4;
  AInventory *this;
  float fVar5;
  double dVar6;
  bool local_139;
  bool local_115;
  TFlags<ActorFlag,_unsigned_int> local_114;
  TVector3<double> local_110;
  undefined1 local_f8 [8];
  DVector2 fogpos;
  DVector2 vector;
  TFlags<ActorFlag,_unsigned_int> local_d0;
  TFlags<ActorFlag,_unsigned_int> local_cc;
  TVector2<double> local_c8;
  TVector2<double> local_b8;
  TVector2<double> local_a8;
  DVector3 local_98;
  double local_80;
  double missilespeed;
  double ceilingheight;
  double floorheight;
  sector_t *psStack_60;
  bool resetpitch;
  sector_t_conflict *destsect;
  player_t *player;
  double aboveFloor;
  DVector3 old;
  bool predicting;
  int flags_local;
  DAngle *angle_local;
  DVector3 *pos_local;
  AActor *thing_local;
  
  local_115 = false;
  if (thing->player != (player_t *)0x0) {
    local_115 = (thing->player->cheats & 0x2000U) != 0;
  }
  old.Z._3_1_ = local_115;
  old.Z._4_4_ = flags;
  TVector3<double>::TVector3((TVector3<double> *)&aboveFloor);
  floorheight._7_1_ = 0;
  local_80 = 0.0;
  AActor::Pos(&local_98,thing);
  TVector3<double>::operator=((TVector3<double> *)&aboveFloor,&local_98);
  dVar6 = AActor::Z(thing);
  player = (player_t *)(dVar6 - thing->floorz);
  TVector2<double>::TVector2(&local_a8,pos);
  psStack_60 = P_PointInSector(&local_a8);
  destsect = (sector_t_conflict *)thing->player;
  if (((player_t *)destsect != (player_t *)0x0) &&
     (((player_t *)destsect)->mo != (APlayerPawn *)thing)) {
    destsect = (sector_t_conflict *)0x0;
  }
  psVar4 = &psStack_60->floorplane;
  TVector2<double>::TVector2(&local_b8,pos);
  ceilingheight = secplane_t::ZatPoint(psVar4,&local_b8);
  psVar4 = &psStack_60->ceilingplane;
  TVector2<double>::TVector2(&local_c8,pos);
  missilespeed = secplane_t::ZatPoint(psVar4,&local_c8);
  iVar1 = (int)thing;
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_cc,
             iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_cc);
  if (uVar3 != 0) {
    local_80 = AActor::VelXYToSpeed(thing);
  }
  if ((old.Z._4_4_ & 0x10) == 0) {
    if ((pos->Z == -2147483648.0) && (!NAN(pos->Z))) {
      if (destsect == (sector_t_conflict *)0x0) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  ((TFlags<ActorFlag,_unsigned_int> *)((long)&vector.Y + 4),
                   iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                           MF_SHOOTABLE));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&vector.Y + 4));
        if (uVar3 == 0) {
          pos->Z = ceilingheight;
        }
        else {
          pos->Z = ceilingheight + (double)player;
          if (missilespeed < pos->Z + thing->Height) {
            pos->Z = missilespeed - thing->Height;
          }
        }
      }
      else {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_d0,
                   iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                           MF_SHOOTABLE));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_d0);
        local_139 = uVar3 == 0 || (double)player == 0.0;
        if (local_139) {
          pos->Z = ceilingheight;
          if ((old.Z._4_4_ & 4) == 0) {
            floorheight._7_1_ = 0;
          }
        }
        else {
          pos->Z = ceilingheight + (double)player;
          if (missilespeed < pos->Z + thing->Height) {
            pos->Z = missilespeed - thing->Height;
          }
        }
      }
    }
  }
  else {
    pos->Z = ceilingheight + (double)player;
  }
  bVar2 = P_TeleportMove(thing,pos,false,true);
  if (!bVar2) {
    return false;
  }
  if (destsect != (sector_t_conflict *)0x0) {
    dVar6 = AActor::Z(thing);
    destsect->planes[1].xform.yOffs = dVar6 + destsect->planes[1].xform.baseyOffs;
    if ((floorheight._7_1_ & 1) != 0) {
      TAngle<double>::operator=
                ((TAngle<double> *)((long)destsect->planes[0].xform.xOffs + 0xa8),0.0);
    }
  }
  if ((old.Z._4_4_ & 4) == 0) {
    TAngle<double>::operator=(&(thing->Angles).Yaw,angle);
  }
  else {
    TAngle<double>::operator=(angle,&(thing->Angles).Yaw);
  }
  if (((old.Z._4_4_ & 2) != 0) && ((old.Z._3_1_ & 1) == 0)) {
    P_SpawnTeleportFog(thing,(DVector3 *)&aboveFloor,true,true);
  }
  if ((old.Z._4_4_ & 1) != 0) {
    if ((old.Z._3_1_ & 1) == 0) {
      TAngle<double>::ToVector((TAngle<double> *)&fogpos.Y,20.0);
      P_GetOffsetPosition(pos->X,pos->Y,fogpos.Y,vector.X);
      dVar6 = AActor::Z(thing);
      TVector3<double>::TVector3(&local_110,(Vector2 *)local_f8,dVar6);
      P_SpawnTeleportFog(thing,&local_110,false,true);
    }
    if ((((thing->player != (player_t *)0x0) &&
         (bVar2 = FBoolCVar::operator_cast_to_bool(&telezoom), bVar2)) &&
        (thing->player->mo == (APlayerPawn *)thing)) && ((old.Z._4_4_ & 8) == 0)) {
      fVar5 = MIN<float>(175.0,thing->player->DesiredFOV + 45.0);
      thing->player->FOV = fVar5;
    }
  }
  if (((thing->player != (player_t *)0x0) && (((old.Z._4_4_ & 1) != 0 || ((old.Z._4_4_ & 4) == 0))))
     && ((old.Z._4_4_ & 8) == 0)) {
    bVar2 = TObjPtr<AInventory>::operator==(&thing->Inventory,(AInventory *)0x0);
    if (!bVar2) {
      this = TObjPtr<AInventory>::operator->(&thing->Inventory);
      bVar2 = AInventory::GetNoTeleportFreeze(this);
      if (bVar2) goto LAB_00604c3a;
    }
    thing->reactiontime = 0x12;
  }
LAB_00604c3a:
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_114,
             iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_114);
  if (uVar3 == 0) {
    if ((((old.Z._4_4_ & 4) == 0) && ((old.Z._4_4_ & 8) == 0)) &&
       (TVector3<double>::Zero(&thing->Vel), destsect != (sector_t_conflict *)0x0)) {
      TVector2<double>::Zero((TVector2<double> *)&destsect->planes[1].xform.Angle);
    }
  }
  else {
    AActor::VelFromAngle(thing,local_80);
  }
  return true;
}

Assistant:

bool P_Teleport (AActor *thing, DVector3 pos, DAngle angle, int flags)
{
	bool predicting = (thing->player && (thing->player->cheats & CF_PREDICTING));

	DVector3 old;
	double aboveFloor;
	player_t *player;
	sector_t *destsect;
	bool resetpitch = false;
	double floorheight, ceilingheight;
	double missilespeed = 0;

	old = thing->Pos();
	aboveFloor = thing->Z() - thing->floorz;
	destsect = P_PointInSector (pos);
	// killough 5/12/98: exclude voodoo dolls:
	player = thing->player;
	if (player && player->mo != thing)
		player = NULL;
	floorheight = destsect->floorplane.ZatPoint (pos);
	ceilingheight = destsect->ceilingplane.ZatPoint (pos);
	if (thing->flags & MF_MISSILE)
	{ // We don't measure z velocity, because it doesn't change.
		missilespeed = thing->VelXYToSpeed();
	}
	if (flags & TELF_KEEPHEIGHT)
	{
		pos.Z = floorheight + aboveFloor;
	}
	else if (pos.Z == ONFLOORZ)
	{
		if (player)
		{
			if (thing->flags & MF_NOGRAVITY && aboveFloor)
			{
				pos.Z = floorheight + aboveFloor;
				if (pos.Z + thing->Height > ceilingheight)
				{
					pos.Z = ceilingheight - thing->Height;
				}
			}
			else
			{
				pos.Z = floorheight;
				if (!(flags & TELF_KEEPORIENTATION))
				{
					resetpitch = false;
				}
			}
		}
		else if (thing->flags & MF_MISSILE)
		{
			pos.Z = floorheight + aboveFloor;
			if (pos.Z + thing->Height > ceilingheight)
			{
				pos.Z = ceilingheight - thing->Height;
			}
		}
		else
		{
			pos.Z = floorheight;
		}
	}
	if (!P_TeleportMove (thing, pos, false))
	{
		return false;
	}
	if (player)
	{
		player->viewz = thing->Z() + player->viewheight;
		if (resetpitch)
		{
			player->mo->Angles.Pitch = 0.;
		}
	}
	if (!(flags & TELF_KEEPORIENTATION))
	{
		thing->Angles.Yaw = angle;
	}
	else
	{
		angle = thing->Angles.Yaw;
	}
	// Spawn teleport fog at source and destination
	if ((flags & TELF_SOURCEFOG) && !predicting)
	{
		P_SpawnTeleportFog(thing, old, true, true); //Passes the actor through which then pulls the TeleFog metadata types based on properties.
	}
	if (flags & TELF_DESTFOG)
	{
		if (!predicting)
		{
			DVector2 vector = angle.ToVector(20);
			DVector2 fogpos = P_GetOffsetPosition(pos.X, pos.Y, vector.X, vector.Y);
			P_SpawnTeleportFog(thing, DVector3(fogpos, thing->Z()), false, true);

		}
		if (thing->player)
		{
			// [RH] Zoom player's field of vision
			// [BC] && bHaltVelocity.
			if (telezoom && thing->player->mo == thing && !(flags & TELF_KEEPVELOCITY))
				thing->player->FOV = MIN (175.f, thing->player->DesiredFOV + 45.f);
		}
	}
	// [BC] && bHaltVelocity.
	if (thing->player && ((flags & TELF_DESTFOG) || !(flags & TELF_KEEPORIENTATION)) && !(flags & TELF_KEEPVELOCITY))
	{
		// Freeze player for about .5 sec
		if (thing->Inventory == NULL || !thing->Inventory->GetNoTeleportFreeze())
			thing->reactiontime = 18;
	}
	if (thing->flags & MF_MISSILE)
	{
		thing->VelFromAngle(missilespeed);
	}
	// [BC] && bHaltVelocity.
	else if (!(flags & TELF_KEEPORIENTATION) && !(flags & TELF_KEEPVELOCITY))
	{ // no fog doesn't alter the player's momentum
		thing->Vel.Zero();
		// killough 10/98: kill all bobbing velocity too
		if (player)	player->Vel.Zero();
	}
	return true;
}